

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void mpickgold(monst *mtmp)

{
  ushort uVar1;
  obj *obj;
  char *pcVar2;
  char *pcVar3;
  int mat_idx;
  obj *gold;
  monst *mtmp_local;
  
  obj = gold_at(level,(int)mtmp->mx,(int)mtmp->my);
  if (obj != (obj *)0x0) {
    uVar1 = *(ushort *)&objects[obj->otyp].field_0x11;
    obj_extract_self(obj);
    add_to_minv(mtmp,obj);
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      if ((flags.verbose != '\0') && ((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0)) {
        pcVar2 = Monnam(mtmp);
        pcVar3 = "money";
        if ((uVar1 >> 4 & 0x1f) == 0xf) {
          pcVar3 = "gold";
        }
        pline("%s picks up some %s.",pcVar2,pcVar3);
      }
      newsym((int)mtmp->mx,(int)mtmp->my);
    }
  }
  return;
}

Assistant:

void mpickgold(struct monst *mtmp)
{
    struct obj *gold;
    int mat_idx;

    if ((gold = gold_at(level, mtmp->mx, mtmp->my)) != 0) {
	mat_idx = objects[gold->otyp].oc_material;
        obj_extract_self(gold);
        add_to_minv(mtmp, gold);
	if (cansee(mtmp->mx, mtmp->my) ) {
	    if (flags.verbose && !mtmp->isgd)
		pline("%s picks up some %s.", Monnam(mtmp),
			mat_idx == GOLD ? "gold" : "money");
	    newsym(mtmp->mx, mtmp->my);
	}
    }
}